

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithScript_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithScript_Test *this)

{
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  bool bVar1;
  reference pvVar2;
  char *lhs;
  AssertionResult gtest_ar;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  SignParameter sign1;
  SignParameter sign2;
  ByteData signature1;
  ByteData signature2;
  ByteData256 sighash;
  SigHashType sighash_type;
  OutPoint outpoint2;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  OutPoint outpoint1;
  ByteData tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  Address asset_address;
  Address address;
  UtxoData utxo3;
  UtxoData utxo2;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffce5c;
  Script *in_stack_ffffffffffffce60;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_ffffffffffffce70;
  allocator_type *in_stack_ffffffffffffce88;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_ffffffffffffce90;
  undefined6 in_stack_ffffffffffffce98;
  undefined1 in_stack_ffffffffffffce9e;
  undefined1 in_stack_ffffffffffffce9f;
  size_type in_stack_ffffffffffffcea0;
  SignParameter *local_3150;
  UtxoData *local_3088;
  string *local_3030;
  Pubkey *local_2fe8;
  AssertHelper local_2f88;
  Message local_2f80;
  string local_2f78 [32];
  AssertionResult local_2f58;
  AssertHelper local_2f48;
  Message local_2f40 [4];
  AssertHelper local_2f20;
  Message local_2f18;
  AssertHelper local_2f10;
  Message local_2f08;
  OutPoint local_2f00;
  AssertHelper local_2ed8;
  Message local_2ed0 [2];
  SignParameter *local_2ec0;
  SignParameter local_2eb8 [120];
  SignParameter local_2e40 [120];
  SignParameter *local_2dc8;
  undefined8 local_2dc0;
  undefined1 local_2db8 [40];
  Pubkey local_2d90 [5];
  SigHashType local_2d14 [12];
  Pubkey local_2d08 [5];
  ByteData256 local_2c90;
  ByteData256 local_2c78;
  SigHashType local_2c5c [12];
  ByteData local_2c50;
  undefined1 local_2c38 [40];
  OutPoint local_2c10;
  AssertHelper local_2be8;
  Message local_2be0;
  AssertHelper local_2bd8;
  Message local_2bd0 [2];
  byte local_2bb9;
  ConstCharPtr local_2bb8;
  AssertHelper local_2bb0;
  Message local_2ba8 [2];
  SigHashType local_2b98 [15];
  allocator local_2b89;
  string local_2b88 [32];
  string local_2b68 [39];
  allocator local_2b41;
  string local_2b40 [32];
  Pubkey local_2b20;
  byte local_2b01;
  ConstCharPtr local_2b00;
  OutPoint local_2af8;
  ByteData local_2ad0;
  AssertHelper local_2ab8;
  Message local_2ab0 [2];
  UtxoData *local_2aa0;
  UtxoData local_2a98 [1264];
  UtxoData local_25a8 [1264];
  UtxoData local_20b8 [1264];
  UtxoData *local_1bc8;
  undefined8 local_1bc0;
  OutPoint local_1ba0 [4];
  allocator local_1ae1;
  string local_1ae0 [32];
  string local_1ac0 [383];
  allocator local_1941;
  string local_1940 [32];
  string local_1920 [383];
  allocator local_17a1;
  string local_17a0 [32];
  ConfidentialAssetId local_1780;
  _func_int **local_1758;
  undefined1 local_1750;
  allocator local_1741;
  string local_1740 [32];
  Script local_1720;
  allocator local_16e1;
  string local_16e0 [32];
  Txid local_16c0;
  undefined8 local_16a0 [5];
  Txid local_1678;
  uint local_1658;
  Script local_1650 [8];
  string local_1468 [32];
  undefined1 local_1448 [671];
  allocator local_11a9;
  string local_11a8 [32];
  ConfidentialAssetId local_1188;
  _func_int **local_1160;
  undefined1 local_1158;
  Script local_1150;
  Script local_1118 [6];
  Script local_fa0;
  allocator local_f61;
  string local_f60 [32];
  Txid local_f40;
  undefined8 local_f20 [5];
  Txid local_ef8;
  uint local_ed8;
  Script local_ed0;
  Script local_e98;
  Address local_e60 [376];
  string local_ce8 [32];
  undefined1 local_cc8 [670];
  undefined1 local_a2a;
  allocator local_a29;
  string local_a28 [39];
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [32];
  string *local_9b8;
  string local_9b0 [32];
  string local_990 [32];
  string local_970 [32];
  string *local_950;
  undefined8 local_948;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> local_940;
  undefined1 local_922;
  allocator local_921;
  string local_920 [39];
  allocator local_8f9;
  string local_8f8 [39];
  allocator local_8d1;
  string local_8d0 [32];
  Pubkey *local_8b0;
  Pubkey local_8a8;
  Pubkey local_890;
  Pubkey local_878;
  undefined1 local_860 [47];
  allocator local_831;
  string local_830 [32];
  ConfidentialAssetId local_810;
  _func_int **local_7e8;
  undefined1 local_7e0;
  allocator local_7d1;
  string local_7d0 [32];
  string local_7b0 [383];
  allocator local_631;
  string local_630 [32];
  Script local_610;
  allocator local_5d1;
  string local_5d0 [32];
  Script local_5b0;
  allocator local_571;
  string local_570 [32];
  Txid local_550;
  undefined8 local_520 [5];
  Txid local_4f8;
  uint local_4d8;
  Script local_4d0;
  Script local_498;
  Address local_460 [376];
  string local_2e8 [32];
  undefined1 local_2c8 [664];
  ElementsAddressFactory local_30 [48];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(local_30,kElementsRegtest);
  cfd::UtxoData::UtxoData((UtxoData *)local_520);
  local_520[0] = 0;
  local_2c8._24_8_ = (pointer)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_571
            );
  cfd::core::Txid::Txid(&local_550,local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x1e5c86);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5d0,"0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc",
             &local_5d1);
  cfd::core::Script::Script(&local_5b0,local_5d0);
  cfd::core::Script::operator=(&local_4d0,&local_5b0);
  cfd::core::Script::~Script(in_stack_ffffffffffffce60);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_630,"210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac",
             &local_631);
  cfd::core::Script::Script(&local_610,local_630);
  cfd::core::Script::operator=(&local_498,&local_610);
  cfd::core::Script::~Script(in_stack_ffffffffffffce60);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7d0,"ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2",&local_7d1)
  ;
  cfd::AddressFactory::GetAddress(local_7b0);
  cfd::core::Address::operator=(local_460,(Address *)local_7b0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce60);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::__cxx11::string::operator=
            (local_2e8,"wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))"
            );
  cfd::core::Amount::Amount((Amount *)&local_7e8,10000000);
  local_2c8[8] = local_7e0;
  local_2c8._0_8_ = local_7e8;
  local_2c8._16_4_ = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_830,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_831
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_810,local_830);
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(local_2c8 + 0x20),&local_810);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1e5f0c);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  local_922 = 1;
  local_8b0 = &local_8a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8d0,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",
             &local_8d1);
  cfd::core::Pubkey::Pubkey(&local_8a8,local_8d0);
  local_8b0 = &local_890;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8f8,"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",
             &local_8f9);
  cfd::core::Pubkey::Pubkey(&local_890,local_8f8);
  local_8b0 = &local_878;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_920,"03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae",
             &local_921);
  cfd::core::Pubkey::Pubkey(&local_878,local_920);
  local_922 = 0;
  local_860._0_8_ = &local_8a8;
  local_860._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x1e6085);
  __l._M_array._6_1_ = in_stack_ffffffffffffce9e;
  __l._M_array._0_6_ = in_stack_ffffffffffffce98;
  __l._M_array._7_1_ = in_stack_ffffffffffffce9f;
  __l._M_len = in_stack_ffffffffffffcea0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffce90,__l,(allocator_type *)in_stack_ffffffffffffce88);
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x1e60b9);
  local_2fe8 = (Pubkey *)local_860;
  do {
    local_2fe8 = local_2fe8 + -1;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x1e60ee);
  } while (local_2fe8 != &local_8a8);
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  local_a2a = 1;
  local_9b8 = local_9b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9d8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",&local_9d9);
  cfd::core::Privkey::FromWif(local_9b0,(NetType)local_9d8,true);
  local_9b8 = local_990;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a00,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",&local_a01);
  cfd::core::Privkey::FromWif(local_990,(NetType)local_a00,true);
  local_9b8 = local_970;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a28,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9",&local_a29);
  cfd::core::Privkey::FromWif(local_970,(NetType)local_a28,true);
  local_a2a = 0;
  local_950 = local_9b0;
  local_948 = 3;
  std::allocator<cfd::core::Privkey>::allocator((allocator<cfd::core::Privkey> *)0x1e62cd);
  __l_00._M_array._6_1_ = in_stack_ffffffffffffce9e;
  __l_00._M_array._0_6_ = in_stack_ffffffffffffce98;
  __l_00._M_array._7_1_ = in_stack_ffffffffffffce9f;
  __l_00._M_len = in_stack_ffffffffffffcea0;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffce90,__l_00,(allocator_type *)in_stack_ffffffffffffce88);
  std::allocator<cfd::core::Privkey>::~allocator((allocator<cfd::core::Privkey> *)0x1e6301);
  local_3030 = (string *)&local_950;
  do {
    local_3030 = local_3030 + -0x20;
    cfd::core::Privkey::~Privkey((Privkey *)0x1e6336);
  } while (local_3030 != local_9b0);
  std::__cxx11::string::~string(local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  std::__cxx11::string::~string(local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  cfd::UtxoData::UtxoData((UtxoData *)local_f20);
  local_f20[0] = 0;
  local_cc8._24_8_ = (pointer)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f60,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",&local_f61
            );
  cfd::core::Txid::Txid(&local_f40,local_f60);
  cfd::core::Txid::operator=(&local_ef8,&local_f40);
  cfd::core::Txid::~Txid((Txid *)0x1e6436);
  std::__cxx11::string::~string(local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  local_ed8 = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((uint)&local_fa0,(vector *)0x2,(bool)((char)local_860 + '\x10'));
  cfd::core::Script::operator=(&local_e98,&local_fa0);
  cfd::core::Script::~Script(in_stack_ffffffffffffce60);
  cfd::AddressFactory::CreateP2shAddress(local_1118);
  cfd::core::Address::operator=(local_e60,(Address *)local_1118);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce60);
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::operator=(&local_ed0,&local_1150);
  cfd::core::Script::~Script(in_stack_ffffffffffffce60);
  std::__cxx11::string::operator=
            (local_ce8,
             "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))"
            );
  cfd::core::Amount::Amount((Amount *)&local_1160,180000);
  local_cc8[8] = local_1158;
  local_cc8._0_8_ = local_1160;
  local_cc8._16_4_ = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_11a8,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",
             &local_11a9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1188,local_11a8);
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(local_cc8 + 0x20),&local_1188);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1e65df);
  std::__cxx11::string::~string(local_11a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a9);
  cfd::UtxoData::UtxoData((UtxoData *)local_16a0);
  local_16a0[0] = 0;
  local_1448._24_8_ = (pointer)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_16e0,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             &local_16e1);
  cfd::core::Txid::Txid(&local_16c0,local_16e0);
  cfd::core::Txid::operator=(&local_1678,&local_16c0);
  cfd::core::Txid::~Txid((Txid *)0x1e668e);
  std::__cxx11::string::~string(local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e1);
  local_1658 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1740,"51",&local_1741);
  cfd::core::Script::Script(&local_1720,local_1740);
  cfd::core::Script::operator=(local_1650,&local_1720);
  cfd::core::Script::~Script(in_stack_ffffffffffffce60);
  std::__cxx11::string::~string(local_1740);
  std::allocator<char>::~allocator((allocator<char> *)&local_1741);
  std::__cxx11::string::operator=(local_1468,"raw(51)");
  cfd::core::Amount::Amount((Amount *)&local_1758,10000);
  local_1448[8] = local_1750;
  local_1448._0_8_ = local_1758;
  local_1448._16_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_17a0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             &local_17a1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1780,local_17a0);
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(local_1448 + 0x20),&local_1780);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1e67fc);
  std::__cxx11::string::~string(local_17a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1940,"2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6",&local_1941);
  cfd::AddressFactory::GetAddress(local_1920);
  std::__cxx11::string::~string(local_1940);
  std::allocator<char>::~allocator((allocator<char> *)&local_1941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ae0,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z",&local_1ae1);
  cfd::AddressFactory::GetAddress(local_1ac0);
  std::__cxx11::string::~string(local_1ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ae1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1ba0,2,0);
  local_2aa0 = local_2a98;
  cfd::UtxoData::UtxoData(local_2aa0,(UtxoData *)local_520);
  local_2aa0 = local_25a8;
  cfd::UtxoData::UtxoData(local_2aa0,(UtxoData *)local_f20);
  local_2aa0 = local_20b8;
  cfd::UtxoData::UtxoData(local_2aa0,(UtxoData *)local_16a0);
  local_1bc8 = local_2a98;
  local_1bc0 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x1e6992);
  __l_01._M_array._6_1_ = in_stack_ffffffffffffce9e;
  __l_01._M_array._0_6_ = in_stack_ffffffffffffce98;
  __l_01._M_array._7_1_ = in_stack_ffffffffffffce9f;
  __l_01._M_len = in_stack_ffffffffffffcea0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffce90,
             __l_01,(allocator_type *)in_stack_ffffffffffffce88);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x1e69c6);
  local_3088 = (UtxoData *)&local_1bc8;
  do {
    local_3088 = local_3088 + -0x4f0;
    cfd::UtxoData::~UtxoData((UtxoData *)in_stack_ffffffffffffce60);
  } while (local_3088 != local_2a98);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::AddInputs((vector *)local_1ba0);
    }
  }
  else {
    testing::Message::Message(local_2ab0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x36f,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2ab8,local_2ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ab8);
    testing::Message::~Message((Message *)0x1e7569);
  }
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_1ba0,(Amount *)local_1920,(ConfidentialAssetId *)local_2c8);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_1ba0,(Amount *)local_1ac0,(ConfidentialAssetId *)local_cc8);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((Amount *)local_1ba0,(ConfidentialAssetId *)local_1448);
  cfd::core::ByteData::ByteData(&local_2ad0);
  cfd::core::OutPoint::OutPoint(&local_2af8,&local_4f8,local_4d8);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2b00,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2b00);
  if (bVar1) {
    local_2b01 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b40,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 &local_2b41);
      cfd::core::Pubkey::Pubkey(&local_2b20,local_2b40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b88,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_2b89);
      cfd::core::Privkey::FromWif(local_2b68,(NetType)local_2b88,true);
      cfd::core::SigHashType::SigHashType(local_2b98);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_1ba0,&local_2af8,&local_2b20,local_2b68,local_2b98,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x1e7796);
      std::__cxx11::string::~string(local_2b88);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b89);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x1e77bd);
      std::__cxx11::string::~string(local_2b40);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b41);
    }
    if ((local_2b01 & 1) == 0) {
      local_2b00.value =
           "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001e796e;
    }
  }
  else {
LAB_001e796e:
    testing::Message::Message(local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2bb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x37c,local_2b00.value);
    testing::internal::AssertHelper::operator=(&local_2bb0,local_2ba8);
    testing::internal::AssertHelper::~AssertHelper(&local_2bb0);
    testing::Message::~Message((Message *)0x1e79d6);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2bb8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2bb8);
  if (bVar1) {
    local_2bb9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Verify(local_1ba0);
    }
    if ((local_2bb9 & 1) != 0) goto LAB_001e7be4;
    local_2bb8.value =
         "Expected: txc.Verify(outpoint1) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_2bd0);
  testing::internal::AssertHelper::AssertHelper
            (&local_2bd8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37e,local_2bb8.value);
  testing::internal::AssertHelper::operator=(&local_2bd8,local_2bd0);
  testing::internal::AssertHelper::~AssertHelper(&local_2bd8);
  testing::Message::~Message((Message *)0x1e7b99);
LAB_001e7be4:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::IgnoreVerify(local_1ba0);
    }
  }
  else {
    testing::Message::Message(&local_2be0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2be8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x37f,
               "Expected: txc.IgnoreVerify(outpoint1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2be8,&local_2be0);
    testing::internal::AssertHelper::~AssertHelper(&local_2be8);
    testing::Message::~Message((Message *)0x1e7ccc);
  }
  cfd::core::OutPoint::OutPoint(&local_2c10,&local_ef8,local_ed8);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_2c38 + 0x1c));
  cfd::core::SigHashType::SigHashType(local_2c5c,(SigHashType *)(local_2c38 + 0x1c));
  uVar3 = 0;
  cfd::ConfidentialTransactionContext::CreateSignatureHash
            (&local_2c50,local_1ba0,&local_2c10,&local_e98,local_2c5c,local_cc8);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_2c38,&local_2c50);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e7dc9);
  pvVar2 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     (&local_940,2);
  cfd::core::SignatureUtil::CalculateEcSignature(&local_2c78,(Privkey *)local_2c38,SUB81(pvVar2,0));
  pvVar2 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     (&local_940,1);
  cfd::core::SignatureUtil::CalculateEcSignature(&local_2c90,(Privkey *)local_2c38,SUB81(pvVar2,0));
  cfd::core::SigHashType::SigHashType(local_2d14,(SigHashType *)(local_2c38 + 0x1c));
  cfd::SignParameter::SignParameter((SignParameter *)local_2d08,&local_2c78,1,local_2d14);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_860 + 0x10),2);
  cfd::SignParameter::SetRelatedPubkey(local_2d08);
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)(local_2db8 + 0x1c),(SigHashType *)(local_2c38 + 0x1c));
  cfd::SignParameter::SignParameter((SignParameter *)local_2d90,&local_2c90,1,local_2db8 + 0x1c);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_860 + 0x10),1);
  cfd::SignParameter::SetRelatedPubkey(local_2d90);
  local_2ec0 = local_2eb8;
  cfd::SignParameter::SignParameter(local_2ec0,(SignParameter *)local_2d08);
  local_2ec0 = local_2e40;
  cfd::SignParameter::SignParameter(local_2ec0,(SignParameter *)local_2d90);
  local_2dc8 = local_2eb8;
  local_2dc0 = 2;
  std::allocator<cfd::SignParameter>::allocator((allocator<cfd::SignParameter> *)0x1e7f55);
  __l_02._M_array._6_1_ = in_stack_ffffffffffffce9e;
  __l_02._M_array._0_6_ = in_stack_ffffffffffffce98;
  __l_02._M_array._7_1_ = in_stack_ffffffffffffce9f;
  __l_02._M_len = in_stack_ffffffffffffcea0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (in_stack_ffffffffffffce90,__l_02,in_stack_ffffffffffffce88);
  std::allocator<cfd::SignParameter>::~allocator((allocator<cfd::SignParameter> *)0x1e7f86);
  local_3150 = (SignParameter *)&local_2dc8;
  do {
    local_3150 = local_3150 + -0x78;
    cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffce60);
  } while (local_3150 != local_2eb8);
  cfd::ConfidentialTransactionContext::AddMultisigSign
            (local_1ba0,(vector *)&local_2c10,(Script *)local_2db8,(AddressType)&local_e98);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Verify(local_1ba0);
    }
  }
  else {
    testing::Message::Message(local_2ed0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x38f,
               "Expected: txc.Verify(outpoint2) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_2ed8,local_2ed0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ed8);
    testing::Message::~Message((Message *)0x1e827c);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2f00,&local_1678,local_1658);
      cfd::ConfidentialTransactionContext::Verify(local_1ba0);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e8339);
    }
  }
  else {
    testing::Message::Message(&local_2f08);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x392,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2f10,&local_2f08);
    testing::internal::AssertHelper::~AssertHelper(&local_2f10);
    testing::Message::~Message((Message *)0x1e8403);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Verify();
    }
  }
  else {
    testing::Message::Message(&local_2f18);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x394,"Expected: txc.Verify() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2f20,&local_2f18);
    testing::internal::AssertHelper::~AssertHelper(&local_2f20);
    testing::Message::~Message((Message *)0x1e852e);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_ffffffffffffce60,
                 (ByteData *)CONCAT44(in_stack_ffffffffffffce5c,uVar3));
      cfd::core::ByteData::~ByteData((ByteData *)0x1e85df);
    }
  }
  else {
    testing::Message::Message(local_2f40);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x396,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2f48,local_2f40);
    testing::internal::AssertHelper::~AssertHelper(&local_2f48);
    testing::Message::~Message((Message *)0x1e8686);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_();
  lhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2f58,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000\""
             ,lhs,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000"
            );
  std::__cxx11::string::~string(local_2f78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f58);
  if (!bVar1) {
    testing::Message::Message(&local_2f80);
    in_stack_ffffffffffffce60 =
         (Script *)testing::AssertionResult::failure_message((AssertionResult *)0x1e87a6);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x397,(char *)in_stack_ffffffffffffce60);
    testing::internal::AssertHelper::operator=(&local_2f88,&local_2f80);
    testing::internal::AssertHelper::~AssertHelper(&local_2f88);
    testing::Message::~Message((Message *)0x1e8803);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e885b);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            (in_stack_ffffffffffffce70);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffce60);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffce60);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e888f);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e889c);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x1e88a9);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e88b6);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e88c3);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e88d0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffce70);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffce60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce60);
  cfd::UtxoData::~UtxoData((UtxoData *)in_stack_ffffffffffffce60);
  cfd::UtxoData::~UtxoData((UtxoData *)in_stack_ffffffffffffce60);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffce70);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffce70);
  cfd::UtxoData::~UtxoData((UtxoData *)in_stack_ffffffffffffce60);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1e8952);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithScript)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1 (p2wsh on p2pk)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc");
  utxo1.redeem_script = Script("210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac");
  utxo1.address = factory.GetAddress("ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2");
  utxo1.descriptor = "wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2wshAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // Address2 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 1;
  utxo2.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo2.address = factory.CreateP2shAddress(utxo2.redeem_script);
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wshAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");

  // Address3 (OP_TRUE)
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 2;
  utxo3.locking_script = Script("51");
  // utxo3.address;
  utxo3.descriptor = "raw(51)";
  utxo3.amount = Amount(int64_t{10000});
  utxo3.address_type = AddressType::kP2shAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address = factory.GetAddress("2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  Address asset_address = factory.GetAddress("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z");

  ConfidentialTransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount, utxo1.asset);
  txc.AddTxOut(asset_address, utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(utxo3.amount, utxo3.asset);

  ByteData tx;

  // sign1 -> fail -> ignore
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)),
      CfdException);

  EXPECT_THROW(txc.Verify(outpoint1), CfdException);
  EXPECT_NO_THROW(txc.IgnoreVerify(outpoint1));

  // sign2 -> manual -> success
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  SigHashType sighash_type;
  ByteData256 sighash = ByteData256(txc.CreateSignatureHash(outpoint2,
      utxo2.redeem_script, sighash_type, utxo2.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  sign2.SetRelatedPubkey(pubkeys[2]);
  SignParameter sign1(signature1, true, sighash_type);
  sign1.SetRelatedPubkey(pubkeys[1]);
  std::vector<SignParameter> signatures = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint2, signatures, utxo2.redeem_script, utxo2.address_type);
  EXPECT_NO_THROW(txc.Verify(outpoint2));

  // sign3 -> ok
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(txc.Verify());

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000");
}